

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QString,_char>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QString,_char>,_QString> *this)

{
  QString::~QString((QString *)0x139e70);
  QStringBuilder<QString,_char>::~QStringBuilder((QStringBuilder<QString,_char> *)0x139e7a);
  return;
}

Assistant:

~QStringBuilder() = default;